

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_context.cpp
# Opt level: O1

void __thiscall
jessilib::impl::timer_context::timer_context
          (timer_context *this,duration_t in_period,function_t *in_callback)

{
  undefined8 uVar1;
  timer_manager *ptVar2;
  rep rVar3;
  
  (this->super_enable_shared_from_this<jessilib::impl::timer_context>)._M_weak_this.
  super___weak_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<jessilib::impl::timer_context>)._M_weak_this.
  super___weak_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_period).__r = in_period.__r;
  *(undefined8 *)&(this->m_callback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_callback).super__Function_base._M_functor + 8) = 0;
  (this->m_callback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_callback)._M_invoker = in_callback->_M_invoker;
  if ((in_callback->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(in_callback->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->m_callback).super__Function_base._M_functor =
         *(undefined8 *)&(in_callback->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->m_callback).super__Function_base._M_functor + 8) = uVar1;
    (this->m_callback).super__Function_base._M_manager =
         (in_callback->super__Function_base)._M_manager;
    (in_callback->super__Function_base)._M_manager = (_Manager_type)0x0;
    in_callback->_M_invoker = (_Invoker_type)0x0;
  }
  (this->m_next).__d.__r = 0;
  ptVar2 = timer_manager::instance();
  (this->m_self)._M_node = (_List_node_base *)&ptVar2->m_detached_timers;
  (this->m_mutex)._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 0x20) = 0;
  (this->m_mutex)._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 0x30) = 0;
  rVar3 = std::chrono::_V2::steady_clock::now();
  (this->m_last_fire_finish).__d.__r = rVar3;
  return;
}

Assistant:

timer_context::timer_context(duration_t in_period, function_t in_callback)
	: m_period{ in_period },
	// m_next{ calc_next() },
	m_callback{ std::move(in_callback) },
	m_self{ timer_manager::instance().m_detached_timers.end() },
	m_last_fire_finish{ std::chrono::steady_clock::now() } {
	// Empty ctor body
}